

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::arity(token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        *this)

{
  unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *puVar1;
  _Storage<unsigned_long,_true> in_RAX;
  assertion_error *this_00;
  undefined8 in_RDX;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  string local_38;
  
  if (this->token_kind_ == function) {
    puVar1 = (this->field_1).unary_operator_;
    if (puVar1 == (unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"assertion \'function_ != nullptr\' failed at  <> :0","");
      assertion_error::assertion_error(this_00,&local_38);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    in_RAX = (_Storage<unsigned_long,_true>)puVar1->precedence_level_;
    uVar2 = CONCAT71((int7)((ulong)in_RDX >> 8),puVar1->is_right_associative_);
  }
  else {
    uVar2 = 0;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RAX._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

jsoncons::optional<std::size_t> arity() const
        {
            if (token_kind_ == jsonpath_token_kind::function)
            {
                JSONCONS_ASSERT(function_ != nullptr);
                return function_->arity();
            }
            return jsoncons::optional<std::size_t>();
        }